

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

bool __thiscall
pbrt::Curve::IntersectRay(Curve *this,Ray *r,Float tMax,optional<pbrt::ShapeIntersection> *si)

{
  float *pfVar1;
  Float FVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  long lVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  Bounds3<float> *b;
  uint depth;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar24 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [60];
  undefined1 auVar27 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Vector3<float> VVar34;
  Point3<float> PVar35;
  initializer_list<pbrt::Point3<float>_> v;
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  Float local_210;
  float local_20c;
  undefined1 local_208 [16];
  array<pbrt::Point3<float>,_4> cp;
  array<pbrt::Point3<float>,_4> cpObj;
  Ray ray;
  Tuple3<pbrt::Point3,_float> local_170;
  Bounds3f rayBounds;
  Transform local_148;
  Bounds3f curveBounds;
  Transform rayFromObject;
  
  *(long *)(in_FS_OFFSET + -0x488) = *(long *)(in_FS_OFFSET + -0x488) + 1;
  sVar14 = 0;
  local_210 = tMax;
  Transform::operator()(&ray,this->common->objectFromRender,r,(Float *)0x0);
  cp_00.n = sVar14;
  cp_00.ptr = (Point3<float> *)0x4;
  CubicBezierControlPoints<pbrt::Point3<float>>
            (&cpObj,(pbrt *)this->common->cpObj,cp_00,this->uMin,this->uMax);
  auVar16._8_8_ = 0;
  auVar16._0_4_ = cpObj.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar16._4_4_ = cpObj.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = cpObj.values[3].super_Tuple3<pbrt::Point3,_float>.x;
  auVar15._4_4_ = cpObj.values[3].super_Tuple3<pbrt::Point3,_float>.y;
  auVar16 = vsubps_avx(auVar15,auVar16);
  auVar24 = ZEXT856(auVar16._8_8_);
  rayFromObject.m.m[0][2] =
       cpObj.values[3].super_Tuple3<pbrt::Point3,_float>.z -
       cpObj.values[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar28 = (undefined1  [60])0x0;
  rayFromObject.m.m[0]._0_8_ = vmovlps_avx(auVar16);
  VVar34 = Cross<float>(&ray.d,(Vector3<float> *)&rayFromObject);
  auVar27._0_4_ = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._4_60_ = auVar28;
  auVar19._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar24;
  auVar15 = auVar19._0_16_;
  auVar29._0_4_ =
       VVar34.super_Tuple3<pbrt::Vector3,_float>.x * VVar34.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar29._4_4_ =
       VVar34.super_Tuple3<pbrt::Vector3,_float>.y * VVar34.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar29._8_4_ = auVar24._0_4_ * auVar24._0_4_;
  auVar29._12_4_ = auVar24._4_4_ * auVar24._4_4_;
  local_208._0_8_ = vmovlps_avx(auVar15);
  auVar16 = vmovshdup_avx(auVar29);
  auVar16 = vfmadd231ss_fma(auVar16,auVar15,auVar15);
  auVar16 = vfmadd231ss_fma(auVar16,auVar27._0_16_,auVar27._0_16_);
  local_208._8_4_ = auVar27._0_4_;
  if ((auVar16._0_4_ == 0.0) && (!NAN(auVar16._0_4_))) {
    rayFromObject.m.m[0][0] = 0.0;
    rayFromObject.m.m[0][1] = 0.0;
    rayFromObject.m.m[0][2] = 0.0;
    CoordinateSystem<float>(&ray.d,(Vector3<float> *)local_208,(Vector3<float> *)&rayFromObject);
  }
  auVar17._0_4_ =
       ray.o.super_Tuple3<pbrt::Point3,_float>.x + ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar17._4_4_ =
       ray.o.super_Tuple3<pbrt::Point3,_float>.y + ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar17._8_8_ = 0;
  auVar24 = ZEXT456(0);
  local_148.m.m[0][2] =
       ray.o.super_Tuple3<pbrt::Point3,_float>.z + ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_148.m.m[0]._0_8_ = vmovlps_avx(auVar17);
  LookAt(&rayFromObject,&ray.o,(Point3f *)&local_148,(Vector3f *)local_208);
  PVar35 = Transform::operator()(&rayFromObject,cpObj.values);
  local_148.m.m[0][2] = PVar35.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar20._8_56_ = auVar24;
  local_148.m.m[0]._0_8_ = vmovlps_avx(auVar20._0_16_);
  PVar35 = Transform::operator()(&rayFromObject,cpObj.values + 1);
  local_148.m.m[1][1] = PVar35.super_Tuple3<pbrt::Point3,_float>.z;
  auVar21._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar21._8_56_ = auVar24;
  uVar4 = vmovlps_avx(auVar21._0_16_);
  local_148.m.m[0][3] = (Float)uVar4;
  local_148.m.m[1][0] = (Float)((ulong)uVar4 >> 0x20);
  PVar35 = Transform::operator()(&rayFromObject,cpObj.values + 2);
  local_148.m.m[2][0] = PVar35.super_Tuple3<pbrt::Point3,_float>.z;
  auVar22._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar22._8_56_ = auVar24;
  local_148.m.m[1]._8_8_ = vmovlps_avx(auVar22._0_16_);
  PVar35 = Transform::operator()(&rayFromObject,cpObj.values + 3);
  local_148.m.m[2][3] = PVar35.super_Tuple3<pbrt::Point3,_float>.z;
  auVar23._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar23._8_56_ = auVar24;
  uVar4 = vmovlps_avx(auVar23._0_16_);
  local_148.m.m[2][1] = (Float)uVar4;
  local_148.m.m[2][2] = (Float)((ulong)uVar4 >> 0x20);
  v._M_len = 4;
  v._M_array = (iterator)&local_148;
  pstd::array<pbrt::Point3<float>,_4>::array(&cp,v);
  auVar25._8_4_ = 0x3f800000;
  auVar25._0_8_ = 0x3f8000003f800000;
  auVar25._12_4_ = 0x3f800000;
  uVar3 = this->uMin;
  uVar5 = this->uMax;
  auVar18._4_4_ = uVar5;
  auVar18._0_4_ = uVar3;
  auVar18._8_8_ = 0;
  auVar16 = vsubps_avx(auVar25,auVar18);
  FVar2 = this->common->width[1];
  auVar6._4_4_ = FVar2;
  auVar6._0_4_ = FVar2;
  auVar6._8_4_ = FVar2;
  auVar6._12_4_ = FVar2;
  auVar15 = vmulps_avx512vl(auVar18,auVar6);
  FVar2 = this->common->width[0];
  auVar7._4_4_ = FVar2;
  auVar7._0_4_ = FVar2;
  auVar7._8_4_ = FVar2;
  auVar7._12_4_ = FVar2;
  auVar15 = vfmadd231ps_avx512vl(auVar15,auVar16,auVar7);
  auVar16 = vmovshdup_avx(auVar15);
  auVar16 = vmaxss_avx(auVar16,auVar15);
  local_20c = auVar16._0_4_;
  Bounds3<float>::Bounds3((Bounds3<float> *)&local_148,cp.values,cp.values + 1);
  Bounds3<float>::Bounds3(&rayBounds,cp.values + 2,cp.values + 3);
  Union<float>(&curveBounds,(Bounds3<float> *)&local_148,&rayBounds);
  Expand<float,float>((Bounds3<float> *)&local_148,(pbrt *)&curveBounds,b,local_20c * 0.5);
  uVar4 = local_148.m.m[0]._0_8_;
  curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = local_148.m.m[0][3];
  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_148.m.m[0][2];
  curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = local_148.m.m[1][1];
  curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = local_148.m.m[1][0];
  local_148.m.m[0][0] = 0.0;
  local_148.m.m[0][1] = 0.0;
  uVar10 = local_148.m.m[0]._0_8_;
  local_148.m.m[0][2] = 0.0;
  local_170.x = 0.0;
  local_170.y = 0.0;
  local_148.m.m[0][0] = (Float)uVar4;
  local_148.m.m[0][1] = SUB84(uVar4,4);
  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_148.m.m[0][0];
  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_148.m.m[0][1];
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(ray.d.super_Tuple3<pbrt::Vector3,_float>.y *
                                          ray.d.super_Tuple3<pbrt::Vector3,_float>.y)),
                            ZEXT416((uint)ray.d.super_Tuple3<pbrt::Vector3,_float>.x),
                            ZEXT416((uint)ray.d.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)ray.d.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)ray.d.super_Tuple3<pbrt::Vector3,_float>.z),auVar16);
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  local_170.z = auVar16._0_4_ * local_210;
  local_148.m.m[0]._0_8_ = uVar10;
  Bounds3<float>::Bounds3(&rayBounds,(Point3<float> *)&local_148,(Point3<float> *)&local_170);
  bVar11 = Overlaps<float>(&rayBounds,&curveBounds);
  if (bVar11) {
    auVar16 = ZEXT816(0) << 0x40;
    lVar13 = 0x20;
    auVar26._8_4_ = 0xc0000000;
    auVar26._0_8_ = 0xc0000000c0000000;
    auVar26._12_4_ = 0xc0000000;
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    while (lVar13 != 0x38) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)((long)cp.values + lVar13 + -0x20);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)&local_20c + lVar13);
      auVar15 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_208 + lVar13 + 4)),
                                SUB6416(ZEXT464(0xc0000000),0),
                                ZEXT416(*(uint *)((long)&local_210 + lVar13)));
      pfVar1 = (float *)((long)&cp.values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar13);
      auVar29 = vfmadd132ps_fma(auVar33,auVar31,auVar26);
      lVar9 = lVar13 + 8;
      lVar13 = lVar13 + 0xc;
      auVar15 = vandps_avx(ZEXT416((uint)(auVar15._0_4_ + *pfVar1)),auVar30);
      auVar32._0_4_ = auVar29._0_4_ + (float)*(undefined8 *)(local_208 + lVar9);
      auVar32._4_4_ = auVar29._4_4_ + (float)((ulong)*(undefined8 *)(local_208 + lVar9) >> 0x20);
      auVar32._8_4_ = auVar29._8_4_ + 0.0;
      auVar32._12_4_ = auVar29._12_4_ + 0.0;
      auVar29 = vandps_avx(auVar32,auVar30);
      auVar6 = vshufps_avx(auVar29,auVar29,0xf5);
      auVar29 = vmaxss_avx(auVar6,auVar29);
      auVar15 = vmaxss_avx(auVar15,auVar29);
      auVar16 = vmaxss_avx(auVar15,auVar16);
    }
    auVar15 = vmaxss_avx(ZEXT416((uint)this->common->width[1]),ZEXT416((uint)this->common->width[0])
                        );
    iVar12 = Log2Int((auVar16._0_4_ * 8.485281) / (auVar15._0_4_ * 0.05 * 8.0));
    local_148.mInv.m[0][3] = rayFromObject.m.m[0][3];
    local_148.mInv.m[0][2] = rayFromObject.m.m[0][2];
    uVar8 = 10;
    if ((uint)(iVar12 / 2) < 10) {
      uVar8 = iVar12 / 2;
    }
    depth = 0;
    if (-2 < iVar12) {
      depth = uVar8;
    }
    local_148.m.m[0][0] = rayFromObject.mInv.m[0][0];
    local_148.m.m[0][1] = rayFromObject.mInv.m[0][1];
    local_148.m.m[0][2] = rayFromObject.mInv.m[0][2];
    local_148.m.m[0][3] = rayFromObject.mInv.m[0][3];
    local_148.m.m[1][0] = rayFromObject.mInv.m[1][0];
    local_148.m.m[1][1] = rayFromObject.mInv.m[1][1];
    local_148.m.m[1][2] = rayFromObject.mInv.m[1][2];
    local_148.m.m[1][3] = rayFromObject.mInv.m[1][3];
    local_148.m.m[2][0] = rayFromObject.mInv.m[2][0];
    local_148.m.m[2][1] = rayFromObject.mInv.m[2][1];
    local_148.m.m[2][2] = rayFromObject.mInv.m[2][2];
    local_148.m.m[2][3] = rayFromObject.mInv.m[2][3];
    local_148.m.m[3][0] = rayFromObject.mInv.m[3][0];
    local_148.m.m[3][1] = rayFromObject.mInv.m[3][1];
    local_148.m.m[3][2] = rayFromObject.mInv.m[3][2];
    local_148.m.m[3][3] = rayFromObject.mInv.m[3][3];
    local_148.mInv.m[0][0] = rayFromObject.m.m[0][0];
    local_148.mInv.m[0][1] = rayFromObject.m.m[0][1];
    local_148.mInv.m[1][0] = rayFromObject.m.m[1][0];
    local_148.mInv.m[1][1] = rayFromObject.m.m[1][1];
    local_148.mInv.m[1][2] = rayFromObject.m.m[1][2];
    local_148.mInv.m[1][3] = rayFromObject.m.m[1][3];
    local_148.mInv.m[2][0] = rayFromObject.m.m[2][0];
    local_148.mInv.m[2][1] = rayFromObject.m.m[2][1];
    local_148.mInv.m[2][2] = rayFromObject.m.m[2][2];
    local_148.mInv.m[2][3] = rayFromObject.m.m[2][3];
    local_148.mInv.m[3][0] = rayFromObject.m.m[3][0];
    local_148.mInv.m[3][1] = rayFromObject.m.m[3][1];
    local_148.mInv.m[3][2] = rayFromObject.m.m[3][2];
    local_148.mInv.m[3][3] = rayFromObject.m.m[3][3];
    cp_01.n = 4;
    cp_01.ptr = cp.values;
    bVar11 = RecursiveIntersect(this,&ray,local_210,cp_01,&local_148,this->uMin,this->uMax,depth,si)
    ;
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Curve::IntersectRay(const Ray &r, Float tMax,
                         pstd::optional<ShapeIntersection> *si) const {
#ifndef PBRT_IS_GPU_CODE
    ++nCurveTests;
#endif
    // Transform _Ray_ to curve's object space
    Ray ray = (*common->objectFromRender)(r);

    // Get object-space control points for curve segment, _cpObj_
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::span<const Point3f>(common->cpObj), uMin, uMax);

    // Project curve control points to plane perpendicular to ray
    Vector3f dx = Cross(ray.d, cpObj[3] - cpObj[0]);
    if (LengthSquared(dx) == 0) {
        Vector3f dy;
        CoordinateSystem(ray.d, &dx, &dy);
    }
    Transform rayFromObject = LookAt(ray.o, ray.o + ray.d, dx);
    pstd::array<Point3f, 4> cp = {rayFromObject(cpObj[0]), rayFromObject(cpObj[1]),
                                  rayFromObject(cpObj[2]), rayFromObject(cpObj[3])};

    // Test ray against bound of projected control points
    Float maxWidth = std::max(Lerp(uMin, common->width[0], common->width[1]),
                              Lerp(uMax, common->width[0], common->width[1]));
    Bounds3f curveBounds = Union(Bounds3f(cp[0], cp[1]), Bounds3f(cp[2], cp[3]));
    curveBounds = Expand(curveBounds, 0.5f * maxWidth);
    Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
    if (!Overlaps(rayBounds, curveBounds))
        return false;

    // Compute refinement depth for curve, _maxDepth_
    Float L0 = 0;
    for (int i = 0; i < 2; ++i)
        L0 = std::max(
            L0, std::max(std::max(std::abs(cp[i].x - 2 * cp[i + 1].x + cp[i + 2].x),
                                  std::abs(cp[i].y - 2 * cp[i + 1].y + cp[i + 2].y)),
                         std::abs(cp[i].z - 2 * cp[i + 1].z + cp[i + 2].z)));

    Float eps = std::max(common->width[0], common->width[1]) * .05f;  // width / 20
    // Compute log base 4 by dividing log2 in half.
    int r0 = Log2Int(1.41421356237f * 6.f * L0 / (8.f * eps)) / 2;
    int maxDepth = Clamp(r0, 0, 10);

    // Recursively test for ray--curve intersection
    pstd::span<const Point3f> cpSpan(cp);
    return RecursiveIntersect(ray, tMax, cpSpan, Inverse(rayFromObject), uMin, uMax,
                              maxDepth, si);
}